

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

long days_untill_year(uint32_t year)

{
  bool bVar1;
  int y;
  uint32_t year_00;
  long lVar2;
  
  lVar2 = 0;
  for (year_00 = 0x7b2; year != year_00; year_00 = year_00 + 1) {
    bVar1 = leapyear(year_00);
    lVar2 = lVar2 + (ulong)bVar1 + 0x16d;
  }
  return lVar2;
}

Assistant:

long days_untill_year(uint32_t year)
{
	long days{ 0 };
	int y{ 1970 };
	while (y != year)
	{
		auto days_in_the_year = leapyear(y) ? 366 : 365;
		days += days_in_the_year;
		++y;
	}
	return days;
}